

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_label.cc
# Opt level: O3

char * bufcache_simple_label(label_data *ld,char *c)

{
  *(float *)c = ld->label;
  *(float *)(c + 4) = ld->weight;
  *(float *)(c + 8) = ld->initial;
  return c + 0xc;
}

Assistant:

char* bufcache_simple_label(label_data* ld, char* c)
{
  memcpy(c, &ld->label, sizeof(ld->label));
  c += sizeof(ld->label);
  memcpy(c, &ld->weight, sizeof(ld->weight));
  c += sizeof(ld->weight);
  memcpy(c, &ld->initial, sizeof(ld->initial));
  c += sizeof(ld->initial);
  return c;
}